

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpbyteaddress.cpp
# Opt level: O0

RTPAddress * __thiscall
jrtplib::RTPByteAddress::CreateCopy(RTPByteAddress *this,RTPMemoryManager *mgr)

{
  RTPByteAddress *this_00;
  RTPByteAddress *a;
  RTPMemoryManager *mgr_local;
  RTPByteAddress *this_local;
  
  this_00 = (RTPByteAddress *)operator_new(0xa0,mgr,0x17);
  RTPByteAddress(this_00,&(this->super_RTPAddress).field_0xc,this->addresslength,this->port);
  return &this_00->super_RTPAddress;
}

Assistant:

RTPAddress *RTPByteAddress::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPByteAddress *a = RTPNew(mgr, RTPMEM_TYPE_CLASS_RTPADDRESS) RTPByteAddress(hostaddress, addresslength, port);
	return a;
}